

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_demon.cpp
# Opt level: O3

int AF_A_SargAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  PClass *pPVar8;
  AActor *self;
  VMValue *pVVar9;
  AActor *pAVar10;
  char *__assertion;
  bool bVar11;
  bool bVar12;
  FName local_34;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bb296;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005bb286;
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_005bb0d7;
    pPVar8 = (self->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar8 = (PClass *)CONCAT44(extraout_var,iVar5);
      (self->super_DThinker).super_DObject.Class = pPVar8;
    }
    bVar11 = pPVar8 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar11;
    bVar12 = pPVar8 == pPVar3;
    if (!bVar12 && !bVar11) {
      do {
        pPVar8 = pPVar8->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
        if (pPVar8 == pPVar3) break;
      } while (pPVar8 != (PClass *)0x0);
    }
    pVVar9 = (VMValue *)(ulong)(bVar12 || bVar11);
    uVar6 = (uint)bVar11;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005bb296;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_005bb286;
LAB_005bb0d7:
    self = (AActor *)0x0;
    pVVar9 = param;
    uVar6 = numparam;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005bb286:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005bb296;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar8 = (PClass *)puVar2[1];
          if (pPVar8 == (PClass *)0x0) {
            pPVar8 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar9,uVar6,ret);
            puVar2[1] = pPVar8;
          }
          bVar11 = pPVar8 != (PClass *)0x0;
          if (pPVar8 != pPVar3 && bVar11) {
            do {
              pPVar8 = pPVar8->ParentClass;
              bVar11 = pPVar8 != (PClass *)0x0;
              if (pPVar8 == pPVar3) break;
            } while (pPVar8 != (PClass *)0x0);
          }
          if (!bVar11) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005bb296;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005bb286;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005bb296:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_demon.cpp"
                    ,0x10,"int AF_A_SargAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pAVar10 = (self->target).field_0.p;
  if (pAVar10 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  A_FaceTarget(self);
  bVar11 = AActor::CheckMeleeRange(self);
  if (!bVar11) {
    return 0;
  }
  uVar6 = FRandom::GenRand32(&pr_sargattack);
  bVar4 = ((char)uVar6 + ((byte)((uVar6 & 0xff) / 5) & 0xfe) * -5) * '\x04' + 4;
  pAVar10 = (self->target).field_0.p;
  if (pAVar10 == (AActor *)0x0) {
LAB_005bb20e:
    pAVar10 = (AActor *)0x0;
  }
  else if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    goto LAB_005bb20e;
  }
  local_34.Index = 0x84;
  local_30.Degrees = 0.0;
  uVar7 = P_DamageMobj(pAVar10,self,self,(uint)bVar4,&local_34,0,&local_30);
  uVar6 = (uint)bVar4;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  pAVar10 = (self->target).field_0.p;
  if (pAVar10 != (AActor *)0x0) {
    if (((pAVar10->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005bb260;
    (self->target).field_0.p = (AActor *)0x0;
  }
  pAVar10 = (AActor *)0x0;
LAB_005bb260:
  P_TraceBleed(uVar6,pAVar10,self);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SargAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = ((pr_sargattack()%10)+1)*4;
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	return 0;
}